

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool-options.h
# Opt level: O2

ToolOptions * __thiscall
wasm::ToolOptions::addFeature
          (ToolOptions *this,Feature feature,string *description,FeatureSet impliedEnable,
          FeatureSet impliedDisable)

{
  string *psVar1;
  Feature f;
  Feature f_00;
  _Any_data local_238;
  code *local_228;
  code *local_220;
  _Any_data local_218;
  code *local_208;
  code *local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  string local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [32];
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"--enable-",&local_38);
  FeatureSet::toString_abi_cxx11_(&local_1b8,(FeatureSet *)(ulong)feature,f);
  std::operator+(&local_1f8,&local_1d8,&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>(local_198,"",&local_37);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"Enable ",&local_36);
  std::operator+(&local_178,&local_158,description);
  std::__cxx11::string::string<std::allocator<char>>(local_138,"Tool options",&local_35);
  local_220 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:223:12)>
              ::_M_invoke;
  local_228 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:223:12)>
              ::_M_manager;
  local_238._M_unused._M_object = this;
  local_238._8_4_ = feature;
  local_238._12_4_ = impliedEnable.features;
  psVar1 = (string *)
           ::wasm::Options::add
                     ((string *)&this->super_Options,(string *)&local_1f8,local_198,
                      (string *)&local_178,(Arguments)local_138,(function *)0x0,SUB81(&local_238,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"--disable-",&local_34);
  FeatureSet::toString_abi_cxx11_(&local_d8,(FeatureSet *)(ulong)feature,f_00);
  std::operator+(&local_118,&local_f8,&local_d8);
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"",&local_33);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Disable ",&local_32);
  std::operator+(&local_98,&local_78,description);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"Tool options",&local_31);
  local_200 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:233:12)>
              ::_M_invoke;
  local_208 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:233:12)>
              ::_M_manager;
  local_218._M_unused._M_object = this;
  local_218._8_4_ = feature;
  local_218._12_4_ = impliedDisable.features;
  ::wasm::Options::add
            (psVar1,(string *)&local_118,local_b8,(string *)&local_98,(Arguments)local_58,
             (function *)0x0,SUB81(&local_218,0));
  std::_Function_base::~_Function_base((_Function_base *)&local_218);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_238);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  return this;
}

Assistant:

ToolOptions& addFeature(FeatureSet::Feature feature,
                          const std::string& description,
                          FeatureSet impliedEnable = FeatureSet::None,
                          FeatureSet impliedDisable = FeatureSet::None) {
    (*this)
      .add(std::string("--enable-") + FeatureSet::toString(feature),
           "",
           std::string("Enable ") + description,
           ToolOptionsCategory,
           Arguments::Zero,
           [this, feature, impliedEnable](Options*, const std::string&) {
             enabledFeatures.set(feature | impliedEnable, true);
             disabledFeatures.set(feature | impliedEnable, false);
           })

      .add(std::string("--disable-") + FeatureSet::toString(feature),
           "",
           std::string("Disable ") + description,
           ToolOptionsCategory,
           Arguments::Zero,
           [this, feature, impliedDisable](Options*, const std::string&) {
             enabledFeatures.set(feature | impliedDisable, false);
             disabledFeatures.set(feature | impliedDisable, true);
           });
    return *this;
  }